

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_4U>::resample
          (ImageT<unsigned_char,_4U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Color *pCVar4;
  void *pvVar5;
  char cVar6;
  uchar uVar7;
  ImageT<unsigned_char,_4U> *this_00;
  long lVar8;
  Resampler *this_01;
  ulong uVar9;
  float *pfVar10;
  runtime_error *this_02;
  uint uVar11;
  uint32_t c_1;
  Contrib_List *pCVar12;
  long lVar13;
  undefined4 in_register_00000034;
  TransferFunctionSRGB *pTVar14;
  undefined4 in_register_00000084;
  char *pFilter;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar15;
  uint32_t c;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  Contrib_List *pCVar20;
  byte *pbVar21;
  ulong uVar22;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *this_03;
  TransferFunctionSRGB *pTVar23;
  pointer __p;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  string_view fmt;
  format_args args;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_4UL> resamplers
  ;
  array<const_float_*,_4UL> outputLine;
  array<std::vector<float,_std::allocator<float>_>,_4UL> samples;
  long lStack_48;
  TransferFunctionLinear tfLinear;
  TransferFunctionSRGB tfSRGB;
  
  pFilter = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar13 = CONCAT44(in_register_00000034,targetWidth);
  uVar11 = (uint)filter;
  aVar15 = in_R9;
  this_00 = (ImageT<unsigned_char,_4U> *)operator_new(0x28);
  ImageT(this_00,targetHeight,uVar11);
  uVar3 = *(undefined8 *)(lVar13 + 0x10);
  (this_00->super_Image).transferFunction = (int)uVar3;
  (this_00->super_Image).primaries = (int)((ulong)uVar3 >> 0x20);
  if ((uVar11 != 0) && (targetHeight != 0)) {
    uVar1 = *(uint *)(lVar13 + 8);
    if ((uVar1 != 0) && (uVar2 = *(uint *)(lVar13 + 0xc), uVar2 != 0)) {
      uVar16 = uVar2;
      if (uVar2 < uVar1) {
        uVar16 = uVar1;
      }
      uVar19 = uVar11;
      if (uVar11 < targetHeight) {
        uVar19 = targetHeight;
      }
      if ((uVar19 < 0x4001) && (uVar16 < 0x4001)) {
        samples._M_elems[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        samples._M_elems[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar8 = 0;
        do {
          resamplers._M_elems[lVar8]._M_t.
          super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
          super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl = (Resampler *)0x0;
          resamplers._M_elems[lVar8 + 1]._M_t.
          super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
          super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
          super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl = (Resampler *)0x0;
          lVar8 = lVar8 + 2;
        } while (lVar8 != 4);
        this_03 = resamplers._M_elems;
        lVar8 = 0;
        do {
          if (lVar8 == 0) {
            pCVar12 = (Contrib_List *)0x0;
            pCVar20 = (Contrib_List *)0x0;
          }
          else {
            pCVar12 = *(Contrib_List **)
                       ((long)resamplers._M_elems[0]._M_t.
                              super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                              .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x30
                       );
            pCVar20 = *(Contrib_List **)
                       ((long)resamplers._M_elems[0]._M_t.
                              super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                              .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x38
                       );
          }
          this_01 = (Resampler *)operator_new(0x78);
          basisu::Resampler::Resampler
                    (this_01,uVar1,uVar2,targetHeight,uVar11,in_R9._0_4_,0.0,1.0,pFilter,pCVar12,
                     pCVar20,filterScale,filterScale,0.0,0.0);
          outputLine._M_elems[0] = (float *)0x0;
          std::__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::reset
                    ((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     this_03,this_01);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     &outputLine);
          checkResamplerStatus
                    ((((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                      &this_03->_M_t)->_M_t).
                     super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                     .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,pFilter);
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     ((long)&samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar8),(ulong)uVar1);
          this_03 = this_03 + 1;
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x60);
        tfSRGB.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_001b5868;
        tfLinear.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_001b58c0;
        pTVar23 = &tfSRGB;
        if (*(int *)(lVar13 + 0x10) != 2) {
          pTVar23 = (TransferFunctionSRGB *)&tfLinear;
        }
        uVar9 = 0;
        iVar17 = 0;
        uVar11 = 0;
        do {
          uVar18 = 0;
          uVar22 = uVar9;
          do {
            pbVar21 = (byte *)(uVar22 * 4 + *(long *)(lVar13 + 0x18));
            lVar8 = -0x60;
            do {
              pTVar14 = pTVar23;
              if (lVar8 == -0x18) {
                pTVar14 = (TransferFunctionSRGB *)&tfLinear;
              }
              (*(pTVar14->super_TransferFunction)._vptr_TransferFunction[1])
                        ((float)*pbVar21 * 0.003921569);
              *(undefined4 *)(*(long *)((long)&lStack_48 + lVar8) + uVar18 * 4) = extraout_XMM0_Da;
              pbVar21 = pbVar21 + 1;
              lVar8 = lVar8 + 0x18;
            } while (lVar8 != 0);
            uVar18 = uVar18 + 1;
            uVar22 = (ulong)((int)uVar22 + 1);
          } while (uVar18 != uVar1);
          lVar8 = 0;
          do {
            cVar6 = basisu::Resampler::put_line
                              ((float *)resamplers._M_elems[lVar8]._M_t.
                                        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                        .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                        _M_head_impl);
            if (cVar6 == '\0') {
              checkResamplerStatus
                        (resamplers._M_elems[lVar8]._M_t.
                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                         .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,pFilter);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          do {
            outputLine._M_elems[2] = (float *)0x0;
            outputLine._M_elems[3] = (float *)0x0;
            outputLine._M_elems[0] = (float *)0x0;
            outputLine._M_elems[1] = (float *)0x0;
            lVar8 = 0;
            do {
              pfVar10 = (float *)basisu::Resampler::get_line();
              outputLine._M_elems[lVar8] = pfVar10;
              pfVar10 = outputLine._M_elems[0];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            if (outputLine._M_elems[0] != (float *)0x0) {
              uVar16 = iVar17 * targetHeight;
              uVar22 = 0;
              do {
                pCVar4 = this_00->pixels;
                lVar8 = 0;
                do {
                  pTVar14 = pTVar23;
                  if (lVar8 == 3) {
                    pTVar14 = (TransferFunctionSRGB *)&tfLinear;
                  }
                  (**(pTVar14->super_TransferFunction)._vptr_TransferFunction)
                            (outputLine._M_elems[lVar8][uVar22]);
                  if (0.0 <= extraout_XMM0_Da_00) {
                    uVar7 = 0xff;
                    if (extraout_XMM0_Da_00 <= 1.0) {
                      uVar7 = (uchar)(int)(extraout_XMM0_Da_00 * 255.0 + 0.5);
                    }
                  }
                  else {
                    uVar7 = '\0';
                  }
                  pCVar4[uVar16].field_0.comps[lVar8] = uVar7;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                uVar22 = uVar22 + 1;
                uVar16 = uVar16 + 1;
              } while (uVar22 != targetHeight);
              iVar17 = iVar17 + 1;
            }
          } while (pfVar10 != (float *)0x0);
          uVar11 = uVar11 + 1;
          uVar9 = (ulong)((int)uVar9 + uVar1);
        } while (uVar11 != uVar2);
        (this->super_Image)._vptr_Image = (_func_int **)this_00;
        lVar13 = 0x18;
        do {
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     ((long)&resamplers._M_elems[0]._M_t.
                             super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                             .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl +
                     lVar13));
          lVar13 = lVar13 + -8;
        } while (lVar13 != -8);
        lVar13 = 0x60;
        do {
          pvVar5 = *(void **)((long)outputLine._M_elems + lVar13 + 8);
          if (pvVar5 != (void *)0x0) {
            operator_delete(pvVar5,*(long *)((long)outputLine._M_elems + lVar13 + 0x18) -
                                   (long)pvVar5);
          }
          lVar13 = lVar13 + -0x18;
        } while (lVar13 != 0);
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
      }
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      resamplers._M_elems[0]._M_t.
      super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
      super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
      super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
           (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
           (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x4000;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2a;
      args.field_1.args_ = aVar15.args_;
      args.desc_ = (unsigned_long_long)&resamplers;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&samples,(v10 *)"Image larger than max supported size of {}",fmt,args);
      std::runtime_error::runtime_error(this_02,(string *)&samples);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 4>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 4]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }